

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void FindHoveredWindow(void)

{
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImVec2 *pIVar4;
  ImVec2 *local_80;
  ImVec2 local_78;
  ImRect local_70;
  ImVec2 local_60;
  ImVec2 hole_size;
  ImVec2 hole_pos;
  ImRect bb;
  ImGuiWindow *window;
  ImVec2 IStack_30;
  int i;
  ImVec2 padding_for_resize;
  ImVec2 padding_regular;
  ImGuiWindow *hovered_window_ignoring_moving_window;
  ImGuiWindow *hovered_window;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  hovered_window_ignoring_moving_window = (ImGuiWindow *)0x0;
  padding_regular.x = 0.0;
  padding_regular.y = 0.0;
  if ((GImGui->MovingWindow != (ImGuiWindow *)0x0) && ((GImGui->MovingWindow->Flags & 0x200U) == 0))
  {
    hovered_window_ignoring_moving_window = GImGui->MovingWindow;
  }
  padding_for_resize = (GImGui->Style).TouchExtraPadding;
  if (((GImGui->IO).ConfigWindowsResizeFromEdges & 1U) == 0) {
    local_80 = &padding_for_resize;
  }
  else {
    local_80 = &GImGui->WindowsHoverPadding;
  }
  IStack_30 = *local_80;
  window._4_4_ = (GImGui->Windows).Size;
LAB_0016c449:
  do {
    do {
      window._4_4_ = window._4_4_ + -1;
      if (window._4_4_ < 0) goto LAB_0016c634;
      pIVar4 = (ImVec2 *)ImVector<ImGuiWindow_*>::operator[](&pIVar2->Windows,window._4_4_);
      IVar1 = *pIVar4;
    } while ((((*(bool *)((long)IVar1 + 0x8e) & 1U) == 0) ||
             ((*(bool *)((long)IVar1 + 0x95) & 1U) != 0)) ||
            ((*(ImGuiWindowFlags *)((long)IVar1 + 0xc) & 0x200U) != 0));
    hole_pos = *(ImVec2 *)((long)IVar1 + 0x1c0);
    if ((*(ImGuiWindowFlags *)((long)IVar1 + 0xc) & 0x1000042U) == 0) {
      ImRect::Expand((ImRect *)&hole_pos,&stack0xffffffffffffffd0);
    }
    else {
      ImRect::Expand((ImRect *)&hole_pos,&padding_for_resize);
    }
    bVar3 = ImRect::Contains((ImRect *)&hole_pos,&(pIVar2->IO).MousePos);
  } while (!bVar3);
  if (((ImVec2ih *)((long)IVar1 + 0x230))->x != 0) {
    ImVec2::ImVec2(&hole_size,
                   ((ImVec2 *)((long)IVar1 + 0x10))->x +
                   (float)(int)((ImVec2ih *)((long)IVar1 + 0x234))->x,
                   *(float *)((long)IVar1 + 0x14) + (float)(int)*(short *)((long)IVar1 + 0x236));
    ImVec2::ImVec2(&local_60,(float)(int)((ImVec2ih *)((long)IVar1 + 0x230))->x,
                   (float)(int)*(short *)((long)IVar1 + 0x232));
    local_78 = operator+(&hole_size,&local_60);
    ImRect::ImRect(&local_70,&hole_size,&local_78);
    bVar3 = ImRect::Contains(&local_70,&(pIVar2->IO).MousePos);
    if (bVar3) goto LAB_0016c449;
  }
  if (hovered_window_ignoring_moving_window == (ImGuiWindow *)0x0) {
    hovered_window_ignoring_moving_window = (ImGuiWindow *)IVar1;
  }
  if ((padding_regular == (ImVec2)0x0) &&
     ((pIVar2->MovingWindow == (ImGuiWindow *)0x0 ||
      (*(ImGuiWindow **)((long)IVar1 + 0x350) != pIVar2->MovingWindow->RootWindow)))) {
    padding_regular = IVar1;
  }
  if ((hovered_window_ignoring_moving_window != (ImGuiWindow *)0x0) &&
     (padding_regular != (ImVec2)0x0)) {
LAB_0016c634:
    pIVar2->HoveredWindow = hovered_window_ignoring_moving_window;
    pIVar2->HoveredWindowUnderMovingWindow = (ImGuiWindow *)padding_regular;
    return;
  }
  goto LAB_0016c449;
}

Assistant:

static void FindHoveredWindow()
{
    ImGuiContext& g = *GImGui;

    ImGuiWindow* hovered_window = NULL;
    ImGuiWindow* hovered_window_ignoring_moving_window = NULL;
    if (g.MovingWindow && !(g.MovingWindow->Flags & ImGuiWindowFlags_NoMouseInputs))
        hovered_window = g.MovingWindow;

    ImVec2 padding_regular = g.Style.TouchExtraPadding;
    ImVec2 padding_for_resize = g.IO.ConfigWindowsResizeFromEdges ? g.WindowsHoverPadding : padding_regular;
    for (int i = g.Windows.Size - 1; i >= 0; i--)
    {
        ImGuiWindow* window = g.Windows[i];
        IM_MSVC_WARNING_SUPPRESS(28182); // [Static Analyzer] Dereferencing NULL pointer.
        if (!window->Active || window->Hidden)
            continue;
        if (window->Flags & ImGuiWindowFlags_NoMouseInputs)
            continue;

        // Using the clipped AABB, a child window will typically be clipped by its parent (not always)
        ImRect bb(window->OuterRectClipped);
        if (window->Flags & (ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_AlwaysAutoResize))
            bb.Expand(padding_regular);
        else
            bb.Expand(padding_for_resize);
        if (!bb.Contains(g.IO.MousePos))
            continue;

        // Support for one rectangular hole in any given window
        // FIXME: Consider generalizing hit-testing override (with more generic data, callback, etc.) (#1512)
        if (window->HitTestHoleSize.x != 0)
        {
            ImVec2 hole_pos(window->Pos.x + (float)window->HitTestHoleOffset.x, window->Pos.y + (float)window->HitTestHoleOffset.y);
            ImVec2 hole_size((float)window->HitTestHoleSize.x, (float)window->HitTestHoleSize.y);
            if (ImRect(hole_pos, hole_pos + hole_size).Contains(g.IO.MousePos))
                continue;
        }

        if (hovered_window == NULL)
            hovered_window = window;
        IM_MSVC_WARNING_SUPPRESS(28182); // [Static Analyzer] Dereferencing NULL pointer.
        if (hovered_window_ignoring_moving_window == NULL && (!g.MovingWindow || window->RootWindow != g.MovingWindow->RootWindow))
            hovered_window_ignoring_moving_window = window;
        if (hovered_window && hovered_window_ignoring_moving_window)
            break;
    }

    g.HoveredWindow = hovered_window;
    g.HoveredWindowUnderMovingWindow = hovered_window_ignoring_moving_window;
}